

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_addstring(luaL_Buffer *B,char *s)

{
  size_t l;
  
  l = strlen(s);
  luaL_addlstring(B,s,l);
  return;
}

Assistant:

LUALIB_API void luaL_addstring(luaL_Buffer *B, const char *s) {
    luaL_addlstring(B, s, strlen(s));
}